

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_synth.cpp
# Opt level: O1

VkPipeline
synthesize_graphics_pipeline
          (StateRecorder *recorder,vector<unsigned_char,_std::allocator<unsigned_char>_> *modules,
          spvc_compiler *compilers,VkPipelineLayout layout,VkRenderPass render_pass,
          uint8_t active_rt_mask,SpecConstant *specs)

{
  undefined4 uVar1;
  VkPipelineVertexInputStateCreateInfo *pVVar2;
  spvc_compiler compiler;
  bool bVar3;
  spvc_result sVar4;
  uint uVar5;
  uint uVar6;
  spvc_basetype sVar7;
  uint uVar8;
  spvc_type type;
  undefined4 *puVar9;
  long lVar10;
  ulong uVar11;
  VkShaderModule module;
  VkPipeline pVVar12;
  pointer *ppuVar13;
  VkShaderStageFlagBits *pVVar14;
  vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  attributes;
  VkVertexInputBindingDescription vertex_binding;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_> stages;
  size_t size;
  spvc_reflected_resource *list;
  VkSampleMask sample_mask;
  VkPipelineInputAssemblyStateCreateInfo ia;
  VkPipelineColorBlendStateCreateInfo blend;
  VkPipelineRasterizationStateCreateInfo ras;
  VkPipelineVertexInputStateCreateInfo vi;
  VkGraphicsPipelineCreateInfo info;
  VkRect2D sci;
  VkSpecializationInfo spec_info;
  VkPipelineColorBlendAttachmentState attachments [8];
  VkPipelineTessellationStateCreateInfo tess;
  VkViewport viewport;
  VkPipelineDynamicStateCreateInfo dyn;
  VkPipelineMultisampleStateCreateInfo ms;
  VkPipelineViewportStateCreateInfo vp;
  vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  local_408;
  VkVertexInputBindingDescription local_3e8;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  local_3d8;
  spvc_compiler *local_3b8;
  ulong local_3b0;
  spvc_reflected_resource *local_3a8;
  VkPipelineLayout local_3a0;
  VkRenderPass local_398;
  VkSampleMask local_38c;
  VkPipelineInputAssemblyStateCreateInfo local_388;
  VkPipelineColorBlendStateCreateInfo local_368;
  VkPipelineRasterizationStateCreateInfo local_328;
  VkPipelineVertexInputStateCreateInfo local_2e8;
  VkGraphicsPipelineCreateInfo local_2b8;
  VkRect2D local_228;
  VkSpecializationInfo local_218;
  VkPipelineShaderStageCreateInfo local_1f8 [5];
  VkPipelineTessellationStateCreateInfo local_f8;
  VkViewport local_d8;
  VkPipelineDynamicStateCreateInfo local_b8;
  VkPipelineMultisampleStateCreateInfo local_98;
  VkPipelineViewportStateCreateInfo local_68;
  
  local_3d8.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (VkPipelineShaderStageCreateInfo *)0x0;
  local_3d8.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (VkPipelineShaderStageCreateInfo *)0x0;
  local_3b8 = compilers;
  local_3a0 = layout;
  local_398 = render_pass;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  reserve(&local_3d8,7);
  local_218.pData =
       (specs->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_218.dataSize =
       (long)(specs->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)local_218.pData;
  local_218.pMapEntries =
       (specs->map_entries).
       super__Vector_base<VkSpecializationMapEntry,_std::allocator<VkSpecializationMapEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_218._0_8_ =
       (ulong)((long)(specs->map_entries).
                     super__Vector_base<VkSpecializationMapEntry,_std::allocator<VkSpecializationMapEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)local_218.pMapEntries) >> 4
       & 0xffffffff;
  ppuVar13 = &(modules->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  module = (VkShaderModule)&DAT_00000001;
  pVVar14 = to_vk_shader_stage;
  do {
    pVVar2 = (VkPipelineVertexInputStateCreateInfo *)
             ((_Vector_impl_data *)(ppuVar13 + -1))->_M_start;
    if (pVVar2 != (VkPipelineVertexInputStateCreateInfo *)*ppuVar13) {
      local_2b8.pNext = (void *)0x0;
      local_2b8.flags = 0;
      local_2b8.stageCount = 0;
      local_2b8.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
      local_2b8._4_4_ = 0;
      local_2b8.pStages = (VkPipelineShaderStageCreateInfo *)((long)*ppuVar13 - (long)pVVar2);
      local_2b8.pVertexInputState = pVVar2;
      bVar3 = Fossilize::StateRecorder::record_shader_module
                        (recorder,module,(VkShaderModuleCreateInfo *)&local_2b8,0);
      if (bVar3) {
        local_1f8[0].pNext = (void *)0x0;
        local_1f8[0].pSpecializationInfo = (VkSpecializationInfo *)0x0;
        local_1f8[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
        local_1f8[0]._4_4_ = 0;
        local_1f8[0].pName = "main";
        local_1f8[0]._16_8_ = (ulong)*pVVar14 << 0x20;
        if (local_218.dataSize != 0) {
          local_1f8[0].pSpecializationInfo = &local_218;
        }
        local_1f8[0].module = module;
        if (local_3d8.
            super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_3d8.
            super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<VkPipelineShaderStageCreateInfo,std::allocator<VkPipelineShaderStageCreateInfo>>::
          _M_realloc_insert<VkPipelineShaderStageCreateInfo_const&>
                    ((vector<VkPipelineShaderStageCreateInfo,std::allocator<VkPipelineShaderStageCreateInfo>>
                      *)&local_3d8,
                     (iterator)
                     local_3d8.
                     super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_1f8);
        }
        else {
          (local_3d8.
           super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pName = "main";
          (local_3d8.
           super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pSpecializationInfo =
               local_1f8[0].pSpecializationInfo;
          (local_3d8.
           super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->flags = local_1f8[0].flags;
          (local_3d8.
           super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->stage = local_1f8[0].stage;
          (local_3d8.
           super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->module = module;
          *(undefined8 *)
           local_3d8.
           super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish = 0x12;
          (local_3d8.
           super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pNext = (void *)0x0;
          local_3d8.
          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_3d8.
               super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (bVar3) goto LAB_001191cf;
      }
      pVVar12 = (VkPipeline)0x0;
      goto LAB_001196c2;
    }
LAB_001191cf:
    module = module + 1;
    ppuVar13 = ppuVar13 + 3;
    pVVar14 = pVVar14 + 1;
  } while (module != (VkShaderModule)0x8);
  lVar10 = 0;
  memset(&local_2b8,0,0x90);
  local_2b8.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_68.pScissors = &local_228;
  local_228.offset.x = 0;
  local_228.offset.y = 0;
  local_228.extent.width = 0x400;
  local_228.extent.height = 0x400;
  local_68.pViewports = &local_d8;
  local_d8.x = 0.0;
  local_d8.y = 0.0;
  local_d8.width = 1024.0;
  local_d8.height = 1024.0;
  local_d8.minDepth = 0.0;
  local_d8.maxDepth = 1.0;
  local_2b8.pViewportState = &local_68;
  local_68.pNext = (void *)0x0;
  local_68.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_68._4_4_ = 0;
  local_68.scissorCount = 1;
  local_68._36_4_ = 0;
  local_68.flags = 0;
  local_68.viewportCount = 1;
  local_2b8.pMultisampleState = &local_98;
  local_98.pNext = (void *)0x0;
  local_98.alphaToCoverageEnable = 0;
  local_98.alphaToOneEnable = 0;
  local_98.sampleShadingEnable = 0;
  local_98.minSampleShading = 0.0;
  local_98.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.pSampleMask = &local_38c;
  local_38c = 0xffffffff;
  local_98.flags = 0;
  local_98.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_2b8.pTessellationState = &local_f8;
  local_f8.sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_f8._4_4_ = 0;
  local_f8.pNext = (void *)0x0;
  local_f8.flags = 0;
  local_f8.patchControlPoints = 1;
  local_2b8.pDynamicState = &local_b8;
  local_b8.flags = 0;
  local_b8.dynamicStateCount = 0;
  local_b8.pDynamicStates = (VkDynamicState *)0x0;
  local_b8.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_b8._4_4_ = 0;
  local_b8.pNext = (void *)0x0;
  local_368.pNext = (void *)0x0;
  local_368.pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
  local_368.blendConstants[0] = 0.0;
  local_368.blendConstants[1] = 0.0;
  local_368.flags = 0;
  local_368.logicOpEnable = 0;
  local_368.logicOp = VK_LOGIC_OP_CLEAR;
  local_368.attachmentCount = 0;
  local_368.blendConstants[2] = 0.0;
  local_368.blendConstants[3] = 0.0;
  local_368.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_368._4_4_ = 0;
  memset(local_1f8,0,0x100);
  puVar9 = (undefined4 *)((long)&local_1f8[0].module + 4);
  do {
    if ((active_rt_mask >> ((uint)lVar10 & 0x1f) & 1) != 0) {
      local_368.attachmentCount = (uint)lVar10 + 1;
      *puVar9 = 0xf;
    }
    lVar10 = lVar10 + 1;
    puVar9 = puVar9 + 8;
  } while (lVar10 != 8);
  local_2b8.pColorBlendState = &local_368;
  local_408.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (VkVertexInputAttributeDescription *)0x0;
  local_408.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (VkVertexInputAttributeDescription *)0x0;
  local_3e8.binding = 0;
  local_3e8.stride = 0;
  local_3e8.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  local_2e8.pNext = (void *)0x0;
  local_2e8.vertexAttributeDescriptionCount = 0;
  local_2e8._36_4_ = 0;
  local_2e8.pVertexAttributeDescriptions = (pointer)0x0;
  local_2e8.flags = 0;
  local_2e8.vertexBindingDescriptionCount = 0;
  local_2e8.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
  local_2e8.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_2e8._4_4_ = 0;
  compiler = *local_3b8;
  local_368.pAttachments = (VkPipelineColorBlendAttachmentState *)local_1f8;
  if (compiler == (spvc_compiler)0x0) {
LAB_00119565:
    local_388.flags = 0;
    local_388.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
    local_388.primitiveRestartEnable = 0;
    local_388._28_4_ = 0;
    local_388._0_8_ = (spvc_resources)0x14;
    local_388.pNext = (void *)0x0;
    if (*local_3b8 != (spvc_compiler)0x0) {
      local_2b8.pInputAssemblyState = &local_388;
      local_388.flags = 0;
      local_388.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    }
    local_2b8.pRasterizationState = &local_328;
    local_328.pNext = (void *)0x0;
    local_328.depthBiasEnable = 0;
    local_328.depthBiasConstantFactor = 0.0;
    local_328.flags = 0;
    local_328.depthClampEnable = 0;
    local_328.depthBiasClamp = 0.0;
    local_328.depthBiasSlopeFactor = 0.0;
    local_328.lineWidth = 0.0;
    local_328._60_4_ = 0;
    local_328._0_8_ = 0x17;
    local_328.cullMode = 0;
    local_328.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
    local_328.rasterizerDiscardEnable = 0;
    local_328.polygonMode = VK_POLYGON_MODE_FILL;
    local_2b8.stageCount =
         (int)((ulong)((long)local_3d8.
                             super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_3d8.
                            super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
    local_2b8.pStages =
         local_3d8.
         super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2b8.layout = local_3a0;
    local_2b8.renderPass = local_398;
    pVVar12 = (VkPipeline)0x0;
    local_408.
    super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
    ._M_impl.super__Vector_impl_data._M_start = local_2e8.pVertexAttributeDescriptions;
    bVar3 = Fossilize::StateRecorder::record_graphics_pipeline
                      (recorder,(VkPipeline)&DAT_00000001,&local_2b8,(VkPipeline *)0x0,0,0,
                       (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
    if (bVar3) {
      if ((((specs->iteration).count != 0) &&
          ((ulong)(specs->iteration).index <
           (ulong)((long)(specs->data).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(specs->data).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2))) && ((specs->iteration).count != 0)
         ) {
        pVVar12 = (VkPipeline)0x0;
        uVar11 = 0;
        do {
          (specs->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[(specs->iteration).index] = (uint)uVar11;
          bVar3 = Fossilize::StateRecorder::record_graphics_pipeline
                            (recorder,(VkPipeline)(ulong)((uint)uVar11 + 2),&local_2b8,
                             (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                             (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
          if (!bVar3) goto LAB_001196ab;
          uVar11 = uVar11 + 1;
        } while (uVar11 < (specs->iteration).count);
      }
      pVVar12 = (VkPipeline)&DAT_00000001;
    }
  }
  else {
    sVar4 = spvc_compiler_create_shader_resources(compiler,(spvc_resources *)&local_388);
    if (sVar4 == SPVC_SUCCESS) {
      sVar4 = spvc_resources_get_resource_list_for_type
                        ((spvc_resources)local_388._0_8_,SPVC_RESOURCE_TYPE_STAGE_INPUT,&local_3a8,
                         &local_3b0);
      if (sVar4 == SPVC_SUCCESS) {
        bVar3 = local_3b0 == 0;
        if (!bVar3) {
          bVar3 = false;
          uVar11 = 0;
          do {
            uVar5 = spvc_compiler_get_decoration
                              (compiler,local_3a8[uVar11].id,SpvDecorationLocation);
            type = spvc_compiler_get_type_handle(compiler,local_3a8[uVar11].type_id);
            uVar6 = spvc_type_get_columns(type);
            sVar7 = spvc_type_get_basetype(type);
            uVar8 = sVar7 - SPVC_BASETYPE_INT16;
            if ((8 < uVar8) || ((399U >> (uVar8 & 0x1f) & 1) == 0)) {
              synthesize_graphics_pipeline();
              break;
            }
            if (uVar6 != 0) {
              uVar1 = *(undefined4 *)(&DAT_002e76b4 + (ulong)uVar8 * 4);
              do {
                local_328._4_4_ = 0;
                local_328.sType = uVar5;
                local_328.pNext = (void *)CONCAT44(local_3e8.stride,uVar1);
                if (local_408.
                    super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_408.
                    super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                  ::_M_realloc_insert<VkVertexInputAttributeDescription>
                            (&local_408,
                             (iterator)
                             local_408.
                             super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (VkVertexInputAttributeDescription *)&local_328);
                }
                else {
                  (local_408.
                   super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->location = uVar5;
                  (local_408.
                   super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->binding = 0;
                  *(void **)&(local_408.
                              super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->format = local_328.pNext;
                  local_408.
                  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       local_408.
                       super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
                local_3e8.stride = local_3e8.stride + 0x10;
                uVar5 = uVar5 + 1;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
            uVar11 = uVar11 + 1;
            bVar3 = uVar11 >= local_3b0;
          } while (uVar11 < local_3b0);
        }
        if (bVar3) {
          local_2b8.pVertexInputState = &local_2e8;
          local_2e8.vertexBindingDescriptionCount = 1;
          local_2e8.pVertexBindingDescriptions = &local_3e8;
          local_2e8.vertexAttributeDescriptionCount =
               (uint32_t)
               ((ulong)((long)local_408.
                              super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_408.
                             super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
          local_2e8.pVertexAttributeDescriptions =
               local_408.
               super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
               ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00119565;
        }
      }
    }
    pVVar12 = (VkPipeline)0x0;
  }
LAB_001196ab:
  if (local_408.
      super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.
                    super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_001196c2:
  if (local_3d8.
      super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.
                    super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3d8.
                          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d8.
                          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pVVar12;
}

Assistant:

static VkPipeline synthesize_graphics_pipeline(StateRecorder &recorder,
                                               const std::vector<uint8_t> *modules,
                                               spvc_compiler *compilers,
                                               VkPipelineLayout layout,
                                               VkRenderPass render_pass,
                                               uint8_t active_rt_mask,
                                               SpecConstant &specs)
{
	std::vector<VkPipelineShaderStageCreateInfo> stages;
	stages.reserve(STAGE_COUNT - 1);

	VkSpecializationInfo spec_info = {};

	spec_info.dataSize = specs.data.size() * sizeof(uint32_t);
	spec_info.pData = specs.data.data();
	spec_info.mapEntryCount = specs.map_entries.size();
	spec_info.pMapEntries = specs.map_entries.data();

	for (unsigned i = 0; i <= STAGE_FRAG; i++)
	{
		if (!modules[i].empty())
		{
			VkShaderModuleCreateInfo module_info = { VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO };
			module_info.codeSize = modules[i].size();
			module_info.pCode = reinterpret_cast<const uint32_t *>(modules[i].data());
			if (!recorder.record_shader_module((VkShaderModule)uint64_t(1 + i), module_info))
				return VK_NULL_HANDLE;

			VkPipelineShaderStageCreateInfo stage = { VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO };
			stage.module = (VkShaderModule)uint64_t(1 + i);
			stage.pName = "main";
			stage.stage = to_vk_shader_stage[i];
			if (spec_info.dataSize != 0)
				stage.pSpecializationInfo = &spec_info;
			stages.push_back(stage);
		}
	}

	VkGraphicsPipelineCreateInfo info = { VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO };
	const VkRect2D sci = {{0, 0}, {1024, 1024}};
	const VkViewport viewport = {0, 0, 1024, 1024, 0, 1};
	VkPipelineViewportStateCreateInfo vp = { VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO };
	{
		vp.scissorCount = 1;
		vp.viewportCount = 1;
		vp.pScissors = &sci;
		vp.pViewports = &viewport;
		info.pViewportState = &vp;
	}

	VkPipelineMultisampleStateCreateInfo ms = { VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO };
	const VkSampleMask sample_mask = 0xffffffffu;
	{
		ms.pSampleMask = &sample_mask;
		ms.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
		info.pMultisampleState = &ms;
	}

	VkPipelineTessellationStateCreateInfo tess = { VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO };
	{
		tess.patchControlPoints = 1;
		info.pTessellationState = &tess;
	}

	VkPipelineDynamicStateCreateInfo dyn = { VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO };
	{
		info.pDynamicState = &dyn;
	}

	VkPipelineColorBlendStateCreateInfo blend = { VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO };
	VkPipelineColorBlendAttachmentState attachments[8] = {};
	{
		for (unsigned i = 0; i < 8; i++)
		{
			if (active_rt_mask & (1u << i))
			{
				blend.attachmentCount = i + 1;
				attachments[i].colorWriteMask = 0xf;
			}
		}
		blend.pAttachments = attachments;
		info.pColorBlendState = &blend;
	}

	std::vector<VkVertexInputAttributeDescription> attributes;
	VkVertexInputBindingDescription vertex_binding = {};

	VkPipelineVertexInputStateCreateInfo vi = { VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO };
	if (compilers[STAGE_VERT])
	{
		if (!append_attributes(compilers[STAGE_VERT], attributes, vertex_binding.stride))
			return VK_NULL_HANDLE;

		vi.vertexBindingDescriptionCount = 1;
		vi.pVertexBindingDescriptions = &vertex_binding;
		vi.vertexAttributeDescriptionCount = uint32_t(attributes.size());
		vi.pVertexAttributeDescriptions = attributes.data();
		info.pVertexInputState = &vi;
	}

	VkPipelineInputAssemblyStateCreateInfo ia = { VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO };
	if (compilers[STAGE_VERT])
	{
		ia.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
		info.pInputAssemblyState = &ia;
	}

	VkPipelineRasterizationStateCreateInfo ras = { VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO };
	{
		ras.cullMode = VK_CULL_MODE_NONE;
		ras.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
		ras.polygonMode = VK_POLYGON_MODE_FILL;
		info.pRasterizationState = &ras;
	}

	info.stageCount = uint32_t(stages.size());
	info.pStages = stages.data();
	info.layout = layout;
	info.renderPass = render_pass;

	if (!recorder.record_graphics_pipeline((VkPipeline)uint64_t(1), info, nullptr, 0))
		return VK_NULL_HANDLE;

	if (specs.iteration.count && specs.iteration.index < specs.data.size())
	{
		for (uint32_t i = 0; i < specs.iteration.count; i++)
		{
			specs.data[specs.iteration.index] = i;
			if (!recorder.record_graphics_pipeline((VkPipeline) uint64_t(2 + i), info, nullptr, 0))
				return VK_NULL_HANDLE;
		}
	}

	return (VkPipeline)uint64_t(1);
}